

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall Lowerer::LowerStSlot(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  Opnd *this_00;
  undefined4 *puVar3;
  Opnd *pOVar4;
  Instr *pIVar5;
  
  this_00 = IR::Instr::UnlinkDst(instr);
  pOVar4 = this_00;
  if (this_00 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2b61,"(dstOpnd)","Expected dst opnd on StSlot");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pOVar4 = (Opnd *)0x0;
  }
  pOVar4 = CreateOpndForSlotAccess(this,pOVar4);
  IR::Opnd::Free(this_00,this->m_func);
  IR::Instr::SetDst(instr,pOVar4);
  pIVar5 = LowererMD::ChangeToWriteBarrierAssign(instr,this->m_func);
  return pIVar5;
}

Assistant:

IR::Instr *
Lowerer::LowerStSlot(IR::Instr *instr)
{
    // StSlot stores the nth Var in the buffer pointed to by the property sym's stack sym.

    IR::Opnd * dstOpnd = instr->UnlinkDst();
    AssertMsg(dstOpnd, "Expected dst opnd on StSlot");
    IR::Opnd * dstNew = this->CreateOpndForSlotAccess(dstOpnd);
    dstOpnd->Free(this->m_func);

    instr->SetDst(dstNew);
    instr = m_lowererMD.ChangeToWriteBarrierAssign(instr, this->m_func);

    return instr;
}